

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

void __thiscall CholeskyFactor::solve(CholeskyFactor *this,QpVector *rhs)

{
  if ((this->uptodate != true) ||
     (((this->runtime->instance).num_var / 2 <= this->numberofreduces &&
      (this->has_negative_eigenvalue == false)))) {
    recompute(this);
  }
  solveL(this,rhs);
  solveLT(this,rhs);
  QpVector::resparsify(rhs);
  return;
}

Assistant:

void solve(QpVector& rhs) {
    if (!uptodate || (numberofreduces >= runtime.instance.num_var / 2 &&
                      !has_negative_eigenvalue)) {
      recompute();
    }
    solveL(rhs);
    solveLT(rhs);

    rhs.resparsify();
  }